

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

int64_t CoreML::Specification::rankOf(ArrayFeatureType *marray)

{
  code *pcVar1;
  ShapeFlexibilityCase SVar2;
  int iVar3;
  ArrayFeatureType_EnumeratedShapes *this;
  ArrayFeatureType_Shape *this_00;
  ArrayFeatureType_ShapeRange *this_01;
  ArrayFeatureType *marray_local;
  
  SVar2 = ArrayFeatureType::ShapeFlexibility_case(marray);
  if (SVar2 == SHAPEFLEXIBILITY_NOT_SET) {
    iVar3 = ArrayFeatureType::shape_size(marray);
    marray_local = (ArrayFeatureType *)(long)iVar3;
  }
  else if (SVar2 == kEnumeratedShapes) {
    this = ArrayFeatureType::enumeratedshapes(marray);
    this_00 = ArrayFeatureType_EnumeratedShapes::shapes(this,0);
    iVar3 = ArrayFeatureType_Shape::shape_size(this_00);
    marray_local = (ArrayFeatureType *)(long)iVar3;
  }
  else {
    if (SVar2 != kShapeRange) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_01 = ArrayFeatureType::shaperange(marray);
    iVar3 = ArrayFeatureType_ShapeRange::sizeranges_size(this_01);
    marray_local = (ArrayFeatureType *)(long)iVar3;
  }
  return (int64_t)marray_local;
}

Assistant:

static inline int64_t rankOf(const Specification::ArrayFeatureType &marray) {
            switch (marray.ShapeFlexibility_case()) {
                case Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case  Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return marray.shape_size();
            }
        }